

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldStatePdu::marshal(MinefieldStatePdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  undefined1 local_58 [8];
  EntityType x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  Point x;
  size_t idx;
  DataStream *dataStream_local;
  MinefieldStatePdu *this_local;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  DataStream::operator<<(dataStream,this->_minefieldSequence);
  DataStream::operator<<(dataStream,this->_forceID);
  sVar2 = std::vector<DIS::Point,_std::allocator<DIS::Point>_>::size(&this->_perimeterPoints);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  EntityType::marshal(&this->_minefieldType,dataStream);
  sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size(&this->_mineType);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  Vector3Double::marshal(&this->_minefieldLocation,dataStream);
  Orientation::marshal(&this->_minefieldOrientation,dataStream);
  DataStream::operator<<(dataStream,this->_appearance);
  DataStream::operator<<(dataStream,this->_protocolMode);
  x._x = 0.0;
  x._y = 0.0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::Point,_std::allocator<DIS::Point>_>::size(&this->_perimeterPoints);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::Point,_std::allocator<DIS::Point>_>::operator[]
                       (&this->_perimeterPoints,x._8_8_);
    Point::Point((Point *)local_30,pvVar3);
    Point::marshal((Point *)local_30,dataStream);
    Point::~Point((Point *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._entityKind = '\0';
  x_1._domain = '\0';
  x_1._country = 0;
  x_1._category = '\0';
  x_1._subcategory = '\0';
  x_1._specific = '\0';
  x_1._extra = '\0';
  while( true ) {
    uVar1 = x_1._8_8_;
    sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size(&this->_mineType);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&this->_mineType,x_1._8_8_);
    EntityType::EntityType((EntityType *)local_58,pvVar4);
    EntityType::marshal((EntityType *)local_58,dataStream);
    EntityType::~EntityType((EntityType *)local_58);
    x_1._8_8_ = x_1._8_8_ + 1;
  }
  return;
}

Assistant:

void MinefieldStatePdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    dataStream << _minefieldSequence;
    dataStream << _forceID;
    dataStream << ( unsigned char )_perimeterPoints.size();
    _minefieldType.marshal(dataStream);
    dataStream << ( unsigned short )_mineType.size();
    _minefieldLocation.marshal(dataStream);
    _minefieldOrientation.marshal(dataStream);
    dataStream << _appearance;
    dataStream << _protocolMode;

     for(size_t idx = 0; idx < _perimeterPoints.size(); idx++)
     {
        Point x = _perimeterPoints[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _mineType.size(); idx++)
     {
        EntityType x = _mineType[idx];
        x.marshal(dataStream);
     }

}